

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O2

void __thiscall catalog::writeBacktoFile(catalog *this)

{
  ostream *poVar1;
  int i;
  long lVar2;
  ofstream tablelist;
  
  if (this->anychangeornot == true) {
    std::ofstream::ofstream(&tablelist,"./file/catalog/table.dat",_S_trunc|_S_out|_S_bin);
    std::ostream::write((char *)&tablelist,(long)&this->tableNumber);
    for (lVar2 = 0; lVar2 < this->tableNumber; lVar2 = lVar2 + 1) {
      poVar1 = std::operator<<((ostream *)&std::cout,"writing back table  -------------------------"
                              );
      poVar1 = std::operator<<(poVar1,(string *)
                                      (this->TableInfoList).
                                      super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start[lVar2]);
      std::endl<char,std::char_traits<char>>(poVar1);
      writeTabletoFile(this,(this->TableInfoList).
                            super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar2],&tablelist);
    }
    std::ofstream::close();
    std::ofstream::~ofstream(&tablelist);
  }
  return;
}

Assistant:

void catalog::writeBacktoFile(){
    if(anychangeornot){
        std::ofstream tablelist("./file/catalog/table.dat", std::ios::out | std::ios::binary | std::ios::trunc);
        tablelist.write(reinterpret_cast<char*>(&tableNumber), sizeof(int));
        for(int i = 0 ; i < tableNumber ; i++){
            std::cout<<"writing back table  -------------------------"<<TableInfoList[i]->tableName<<std::endl;
            writeTabletoFile(TableInfoList[i],tablelist);
        }
        tablelist.close();
    }
    return;
}